

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::SerializePartialToCodedStream
          (MessageLite *this,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  LogMessage *pLVar4;
  long *in_RDI;
  int final_byte_count;
  int original_byte_count;
  size_t size;
  MessageLite *in_stack_000000b8;
  size_t in_stack_000000c0;
  size_t in_stack_000000c8;
  size_t in_stack_000000d0;
  LogMessage *in_stack_ffffffffffffff48;
  CodedOutputStream *in_stack_ffffffffffffff50;
  CodedOutputStream *in_stack_ffffffffffffff58;
  LogMessage *in_stack_ffffffffffffff60;
  string local_78 [40];
  CodedOutputStream *in_stack_ffffffffffffffb0;
  unsigned_long in_stack_ffffffffffffffd8;
  bool local_1;
  
  pLVar4 = (LogMessage *)(**(code **)(*in_RDI + 0x58))();
  if (pLVar4 < (LogMessage *)0x80000000) {
    iVar2 = io::CodedOutputStream::ByteCount(in_stack_ffffffffffffff50);
    SerializeWithCachedSizes((MessageLite *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    bVar1 = io::CodedOutputStream::HadError(in_stack_ffffffffffffffb0);
    if (bVar1) {
      local_1 = false;
    }
    else {
      iVar3 = io::CodedOutputStream::ByteCount(in_stack_ffffffffffffff50);
      if ((LogMessage *)(long)(iVar3 - iVar2) != pLVar4) {
        (**(code **)(*in_RDI + 0x58))();
        anon_unknown_16::ByteSizeConsistencyError
                  (in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
      }
      local_1 = true;
    }
  }
  else {
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff60,
               (LogLevel_conflict)((ulong)in_stack_ffffffffffffff58 >> 0x20),
               (char *)in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    (**(code **)(*in_RDI + 0x10))(local_78);
    internal::LogMessage::operator<<
              ((LogMessage *)in_stack_ffffffffffffff50,(string *)in_stack_ffffffffffffff48);
    internal::LogMessage::operator<<
              ((LogMessage *)in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48);
    pLVar4 = internal::LogMessage::operator<<(pLVar4,in_stack_ffffffffffffffd8);
    internal::LogFinisher::operator=((LogFinisher *)pLVar4,in_stack_ffffffffffffff48);
    std::__cxx11::string::~string(local_78);
    internal::LogMessage::~LogMessage((LogMessage *)0x3f0600);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool MessageLite::SerializePartialToCodedStream(
    io::CodedOutputStream* output) const {
  const size_t size = ByteSizeLong();  // Force size to be cached.
  if (size > INT_MAX) {
    GOOGLE_LOG(ERROR) << GetTypeName()
               << " exceeded maximum protobuf size of 2GB: " << size;
    return false;
  }

  int original_byte_count = output->ByteCount();
  SerializeWithCachedSizes(output);
  if (output->HadError()) {
    return false;
  }
  int final_byte_count = output->ByteCount();

  if (final_byte_count - original_byte_count != size) {
    ByteSizeConsistencyError(size, ByteSizeLong(),
                             final_byte_count - original_byte_count, *this);
  }

  return true;
}